

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O0

void makewt(size_t nw,size_t *ip,float *w)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_64;
  float local_58;
  float y;
  float x;
  float delta;
  size_t nwh;
  size_t j;
  float *w_local;
  size_t *ip_local;
  size_t nw_local;
  
  *ip = nw;
  ip[1] = 1;
  if (2 < nw) {
    uVar1 = nw >> 1;
    fVar2 = atanf(1.0);
    fVar2 = fVar2 / (float)uVar1;
    *w = 1.0;
    w[1] = 0.0;
    fVar3 = cosf(fVar2 * (float)uVar1);
    w[uVar1] = fVar3;
    w[uVar1 + 1] = w[uVar1];
    if (2 < uVar1) {
      for (nwh = 2; nwh < uVar1; nwh = nwh + 2) {
        local_58 = (float)nwh;
        fVar3 = cosf(fVar2 * local_58);
        local_64 = (float)nwh;
        fVar4 = sinf(fVar2 * local_64);
        w[nwh] = fVar3;
        w[nwh + 1] = fVar4;
        w[nw - nwh] = fVar4;
        w[(nw - nwh) + 1] = fVar3;
      }
      bitrv2(nw,ip + 2,w);
    }
  }
  return;
}

Assistant:

static void makewt(size_t nw, size_t *ip, float *w) {
    size_t j, nwh;
    float delta, x, y;

    ip[0] = nw;
    ip[1] = 1;
    if (nw > 2) {
        nwh = nw >> 1;
        delta = atanf(1.0f) / nwh;
        w[0] = 1;
        w[1] = 0;
        w[nwh] = cosf(delta * nwh);
        w[nwh + 1] = w[nwh];
        if (nwh > 2) {
            for (j = 2; j < nwh; j += 2) {
                x = cosf(delta * j);
                y = sinf(delta * j);
                w[j] = x;
                w[j + 1] = y;
                w[nw - j] = y;
                w[nw - j + 1] = x;
            }
            bitrv2(nw, ip + 2, w);
        }
    }
}